

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateLdFldWithCachedType
          (Lowerer *this,Instr *instrLdFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  uint uVar1;
  InlineCacheIndex IVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint16 uVar9;
  BailOutKind BVar10;
  uint uVar11;
  uint functionId;
  undefined4 *puVar12;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  char16 *pcVar13;
  PropertySym *pPVar14;
  JITTimeFunctionBody *this_02;
  char16 *pcVar15;
  LabelInstr *labelObjCheckFailed;
  RegOpnd *pRVar16;
  Opnd *this_03;
  IndirOpnd *src;
  MemRefOpnd *pMVar17;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInfo *pBVar18;
  char16_t *pcVar19;
  char16_t *pcVar20;
  LabelInstr *local_50;
  
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17bd,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
  *continueAsHelperOut = false;
  if (labelHelperOut == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c0,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
  *labelHelperOut = (LabelInstr *)0x0;
  if (typeOpndOut == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c3,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
  *typeOpndOut = (RegOpnd *)0x0;
  bVar4 = IR::Opnd::IsSymOpnd(instrLdFld->m_src1);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c6,"(instrLdFld->GetSrc1()->IsSymOpnd())",
                       "instrLdFld->GetSrc1()->IsSymOpnd()");
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
  this_00 = IR::Opnd::AsSymOpnd(instrLdFld->m_src1);
  bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar4) {
    return false;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrLdFld->m_src1);
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if (!bVar4) {
    return false;
  }
  bVar4 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(this_01);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17d2,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(this_01);
  if ((!bVar4) && (bVar4 = IR::PropertySymOpnd::NeedsLocalTypeCheck(this_01), !bVar4)) {
    return false;
  }
  bVar4 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(this_01);
  if (bVar4) {
    if ((instrLdFld->field_0x38 & 0x10) != 0) {
      BVar10 = IR::Instr::GetBailOutKind(instrLdFld);
      bVar4 = IR::IsTypeCheckBailOutKind(BVar10);
      if (bVar4) goto LAB_00567a66;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17d9,
                       "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind())))"
                       ,
                       "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind()))"
                      );
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
LAB_00567a66:
  bVar4 = IR::PropertySymOpnd::IsTypeCheckProtected(this_01);
  if ((bVar4) && (this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17dd,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar4) goto LAB_00568075;
    *puVar12 = 0;
  }
  uVar11 = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ObjTypeSpecPhase,uVar11,functionId);
  if (bVar4) {
    pcVar13 = Js::OpCodeUtil::GetOpCodeName(instrLdFld->m_opcode);
    pPVar14 = Sym::AsPropertySym((this_01->super_SymOpnd).m_sym);
    uVar1 = pPVar14->m_propertyId;
    this_02 = Func::GetJITFunctionBody(this->m_func);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(this_02);
    pcVar20 = L"ObjTypeSpecFldInfo";
    if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      pcVar20 = L"empty";
    }
    pcVar19 = L"true";
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) {
      pcVar19 = L"false";
    }
    Output::Print(L"Field load: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar13,(ulong)uVar1,pcVar15,(ulong)this_01->m_inlineCacheIndex,pcVar20,pcVar19);
    Output::Flush();
  }
  bVar4 = IR::PropertySymOpnd::HasFinalType(this_01);
  if ((bVar4) && (bVar4 = IR::PropertySymOpnd::IsLoadedFromProto(this_01), !bVar4)) {
    IR::PropertySymOpnd::UpdateSlotForFinalType(this_01);
  }
  if ((instrLdFld->field_0x38 & 0x10) == 0) {
    bVar4 = false;
  }
  else {
    BVar10 = IR::Instr::GetBailOutKind(instrLdFld);
    bVar4 = IR::IsTypeCheckBailOutKind(BVar10);
  }
  bVar5 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(this_01);
  bVar6 = IR::PropertySymOpnd::NeedsLocalTypeCheck(this_01);
  bVar7 = IR::PropertySymOpnd::NeedsLoadFromProtoTypeCheck(this_01);
  if ((bVar6 || bVar7) || bVar5) {
    if (bVar7) {
      IR::PropertySymOpnd::EnsureGuardedPropOps(this_01,this->m_func->m_alloc);
      uVar11 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_01);
      IR::PropertySymOpnd::SetGuardedPropOp(this_01,uVar11);
    }
    local_50 = IR::LabelInstr::New(Label,this->m_func,true);
    labelObjCheckFailed = local_50;
    if (bVar4 == false) {
      labelObjCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
    }
    pRVar16 = GenerateCachedTypeCheck
                        (this,instrLdFld,this_01,labelObjCheckFailed,local_50,(LabelInstr *)0x0);
    *typeOpndOut = pRVar16;
  }
  else {
    local_50 = (LabelInstr *)0x0;
    labelObjCheckFailed = (LabelInstr *)0x0;
  }
  bVar8 = IR::PropertySymOpnd::IsLoadedFromProto(this_01);
  if (bVar8) {
    this_03 = LoadSlotArrayWithCachedProtoType(this,instrLdFld,this_01);
  }
  else {
    this_03 = LoadSlotArrayWithCachedLocalType(this,instrLdFld,this_01);
  }
  uVar9 = IR::PropertySymOpnd::GetSlotIndex(this_01);
  if (uVar9 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1815,"(index != (uint16)-1)","index != (uint16)-1");
    if (!bVar8) goto LAB_00568075;
    *puVar12 = 0;
  }
  bVar8 = IR::Opnd::IsRegOpnd(this_03);
  if (bVar8) {
    pRVar16 = IR::Opnd::AsRegOpnd(this_03);
    src = IR::IndirOpnd::New(pRVar16,(uint)uVar9 << 3,TyInt64,this->m_func,false);
  }
  else {
    bVar8 = IR::Opnd::IsMemRefOpnd(this_03);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x181d,"(opndSlotArray->IsMemRefOpnd())","opndSlotArray->IsMemRefOpnd()");
      if (!bVar8) goto LAB_00568075;
      *puVar12 = 0;
    }
    pMVar17 = IR::Opnd::AsMemRefOpnd(this_03);
    src = (IndirOpnd *)
          IR::MemRefOpnd::New((void *)((ulong)uVar9 * 8 + pMVar17->m_memLoc),TyInt64,this->m_func,
                              AddrOpndKindDynamicPropertySlotRef);
  }
  InsertMove(instrLdFld->m_dst,&src->super_Opnd,instrLdFld,true);
  if ((bVar5 || bVar6) || bVar7) {
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrLdFld,&instr->super_Instr);
    IR::Instr::InsertBefore(instrLdFld,&local_50->super_Instr);
    IR::Instr::InsertAfter(instrLdFld,&branchTarget->super_Instr);
    if (bVar4 == false) {
      *continueAsHelperOut = true;
      if (labelObjCheckFailed == (LabelInstr *)0x0 || labelObjCheckFailed == local_50) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x184b,
                           "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed)"
                           ,
                           "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed"
                          );
        if (!bVar4) goto LAB_00568075;
        *puVar12 = 0;
      }
      *labelHelperOut = labelObjCheckFailed;
      return false;
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01447bf0,ObjTypeSpecIsolatedFldOpsWithBailOutPhase)
    ;
    if ((!bVar4) && (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 4) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1838,
                         "(Js::Configuration::Global.flags.On.IsEnabled((Js::ObjTypeSpecIsolatedFldOpsWithBailOutPhase)) || !propertySymOpnd->IsTypeDead())"
                         ,"Why does a field load have a type check bailout, if its type is dead?");
      if (!bVar4) {
LAB_00568075:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar12 = 0;
    }
    pBVar18 = IR::Instr::GetBailOutInfo(instrLdFld);
    if (pBVar18->bailOutInstr != instrLdFld) {
      IVar2 = this_01->m_inlineCacheIndex;
      pBVar18 = IR::Instr::GetBailOutInfo(instrLdFld);
      pBVar18->polymorphicCacheIndex = IVar2;
    }
    IR::Instr::FreeDst(instrLdFld);
    IR::Instr::FreeSrc1(instrLdFld);
    instrLdFld->m_opcode = BailOut;
    GenerateBailOut(this,instrLdFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  else {
    if (local_50 != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1826,"(labelTypeCheckFailed == nullptr)",
                         "labelTypeCheckFailed == nullptr");
      if (!bVar4) goto LAB_00568075;
      *puVar12 = 0;
    }
    if (((instrLdFld->field_0x38 & 0x10) != 0) &&
       (bVar4 = IR::Instr::HasLazyBailOut(instrLdFld), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1827,"(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut())",
                         "Why does a direct field load have bailout that is not lazy?");
      if (!bVar4) goto LAB_00568075;
      *puVar12 = 0;
    }
    IR::Instr::Remove(instrLdFld);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateLdFldWithCachedType(IR::Instr * instrLdFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::Opnd *opnd;
    IR::LabelInstr *labelObjCheckFailed = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrLdFld->GetSrc1()->IsSymOpnd());
    if (!instrLdFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrLdFld->GetSrc1()->AsPropertySymOpnd();
    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field load: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrLdFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex,
        propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind());

    // If the hard-coded type is not available here, do a type check, and branch to the helper if the check fails.
    // In the prototype case, we have to check the type even if it was checked upstream, to cover the case where
    // the property has been added locally. Note that this is not necessary if the proto chain has been checked,
    // because then we know there's been no store of the property since the type was checked.
    bool emitPrimaryTypeCheck = propertySymOpnd->NeedsPrimaryTypeCheck();
    bool emitLocalTypeCheck = propertySymOpnd->NeedsLocalTypeCheck();
    bool emitLoadFromProtoTypeCheck = propertySymOpnd->NeedsLoadFromProtoTypeCheck();
    bool emitTypeCheck = emitPrimaryTypeCheck || emitLocalTypeCheck || emitLoadFromProtoTypeCheck;

    if (emitTypeCheck)
    {
        if (emitLoadFromProtoTypeCheck)
        {
            propertySymOpnd->EnsureGuardedPropOps(this->m_func->m_alloc);
            propertySymOpnd->SetGuardedPropOp(propertySymOpnd->GetObjTypeSpecFldId());
        }
        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelTypeCheckFailed : IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        *typeOpndOut = this->GenerateCachedTypeCheck(instrLdFld, propertySymOpnd, labelObjCheckFailed, labelTypeCheckFailed);
    }

    IR::Opnd *opndSlotArray;
    if (propertySymOpnd->IsLoadedFromProto())
    {
        opndSlotArray = this->LoadSlotArrayWithCachedProtoType(instrLdFld, propertySymOpnd);
    }
    else
    {
        opndSlotArray = this->LoadSlotArrayWithCachedLocalType(instrLdFld, propertySymOpnd);
    }

    // Load the value from the slot, getting the slot ID from the cache.
    uint16 index = propertySymOpnd->GetSlotIndex();
    AssertOrFailFast(index != (uint16)-1);

    if (opndSlotArray->IsRegOpnd())
    {
        opnd = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, this->m_func);
    }
    else
    {
        Assert(opndSlotArray->IsMemRefOpnd());
        opnd = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, this->m_func, IR::AddrOpndKindDynamicPropertySlotRef);
    }
    Lowerer::InsertMove(instrLdFld->GetDst(), opnd, instrLdFld);

    // We eliminate the helper, or the type check succeeds, or we bail out before the operation.
    // Either delete the original instruction or replace it with a bailout.
    if (!emitPrimaryTypeCheck && !emitLocalTypeCheck && !emitLoadFromProtoTypeCheck)
    {
        Assert(labelTypeCheckFailed == nullptr);
        AssertMsg(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut(), "Why does a direct field load have bailout that is not lazy?");
        instrLdFld->Remove();
        return true;
    }

    // Otherwise, branch around the bailout or helper.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrLdFld->InsertBefore(instr);

    // Insert the bailout or helper label here.
    instrLdFld->InsertBefore(labelTypeCheckFailed);
    instrLdFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        AssertMsg(PHASE_ON1(Js::ObjTypeSpecIsolatedFldOpsWithBailOutPhase) || !propertySymOpnd->IsTypeDead(),
            "Why does a field load have a type check bailout, if its type is dead?");

        // Convert the original instruction to a bailout.
        if (instrLdFld->GetBailOutInfo()->bailOutInstr != instrLdFld)
        {
            // Set the cache index in the bailout info so that the bailout code will write it into the
            // bailout record at runtime.
            instrLdFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        instrLdFld->FreeDst();
        instrLdFld->FreeSrc1();
        instrLdFld->m_opcode = Js::OpCode::BailOut;
        this->GenerateBailOut(instrLdFld);

        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}